

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void Diligent::anon_unknown_227::CreateRayTracingPipeline
               (RenderDeviceVkImpl *pDeviceVk,
               vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               *vkStages,
               vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
               *vkShaderGroups,PipelineLayoutVk *Layout,PipelineStateDesc *PSODesc,
               RayTracingPipelineDesc *RayTracingPipeline,PipelineWrapper *Pipeline,
               VkPipelineCache vkPSOCache)

{
  size_type sVar1;
  PipelineWrapper local_c0;
  undefined1 local_a8 [8];
  VkRayTracingPipelineCreateInfoKHR PipelineCI;
  VulkanLogicalDevice *LogicalDevice;
  RayTracingPipelineDesc *RayTracingPipeline_local;
  PipelineStateDesc *PSODesc_local;
  PipelineLayoutVk *Layout_local;
  vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  *vkShaderGroups_local;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  *vkStages_local;
  RenderDeviceVkImpl *pDeviceVk_local;
  
  PipelineCI._96_8_ = RenderDeviceVkImpl::GetLogicalDevice(pDeviceVk);
  memset(local_a8,0,0x68);
  local_a8._0_4_ = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
  PipelineCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  PipelineCI._4_4_ = 0;
  PipelineCI.pNext._0_4_ = 1;
  sVar1 = std::
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          ::size(vkStages);
  PipelineCI.pNext._4_4_ = (undefined4)sVar1;
  PipelineCI._16_8_ =
       std::
       vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
       data(vkStages);
  sVar1 = std::
          vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ::size(vkShaderGroups);
  PipelineCI.pStages._0_4_ = (undefined4)sVar1;
  PipelineCI._32_8_ =
       std::
       vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
       ::data(vkShaderGroups);
  PipelineCI.pGroups._0_4_ = (uint)RayTracingPipeline->MaxRecursionDepth;
  PipelineCI.maxPipelineRayRecursionDepth = 0;
  PipelineCI._52_4_ = 0;
  PipelineCI.pLibraryInfo = (VkPipelineLibraryCreateInfoKHR *)0x0;
  PipelineCI.pLibraryInterface = (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0;
  PipelineCI.pDynamicState =
       (VkPipelineDynamicStateCreateInfo *)PipelineLayoutVk::GetVkPipelineLayout(Layout);
  PipelineCI.layout = (VkPipelineLayout)0x0;
  PipelineCI.basePipelineHandle._0_4_ = 0xffffffff;
  VulkanUtilities::VulkanLogicalDevice::CreateRayTracingPipeline
            (&local_c0,(VulkanLogicalDevice *)PipelineCI._96_8_,
             (VkRayTracingPipelineCreateInfoKHR *)local_a8,vkPSOCache,
             (PSODesc->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  operator=(Pipeline,&local_c0);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  ~VulkanObjectWrapper(&local_c0);
  return;
}

Assistant:

void CreateRayTracingPipeline(RenderDeviceVkImpl*                                      pDeviceVk,
                              const std::vector<VkPipelineShaderStageCreateInfo>&      vkStages,
                              const std::vector<VkRayTracingShaderGroupCreateInfoKHR>& vkShaderGroups,
                              const PipelineLayoutVk&                                  Layout,
                              const PipelineStateDesc&                                 PSODesc,
                              const RayTracingPipelineDesc&                            RayTracingPipeline,
                              VulkanUtilities::PipelineWrapper&                        Pipeline,
                              VkPipelineCache                                          vkPSOCache)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = pDeviceVk->GetLogicalDevice();

    VkRayTracingPipelineCreateInfoKHR PipelineCI{};
    PipelineCI.sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
    PipelineCI.pNext = nullptr;
#ifdef DILIGENT_DEBUG
    PipelineCI.flags = VK_PIPELINE_CREATE_DISABLE_OPTIMIZATION_BIT;
#endif

    PipelineCI.stageCount                   = static_cast<Uint32>(vkStages.size());
    PipelineCI.pStages                      = vkStages.data();
    PipelineCI.groupCount                   = static_cast<Uint32>(vkShaderGroups.size());
    PipelineCI.pGroups                      = vkShaderGroups.data();
    PipelineCI.maxPipelineRayRecursionDepth = RayTracingPipeline.MaxRecursionDepth;
    PipelineCI.pLibraryInfo                 = nullptr;
    PipelineCI.pLibraryInterface            = nullptr;
    PipelineCI.pDynamicState                = nullptr;
    PipelineCI.layout                       = Layout.GetVkPipelineLayout();
    PipelineCI.basePipelineHandle           = VK_NULL_HANDLE; // a pipeline to derive from
    PipelineCI.basePipelineIndex            = -1;             // an index into the pCreateInfos parameter to use as a pipeline to derive from

    Pipeline = LogicalDevice.CreateRayTracingPipeline(PipelineCI, vkPSOCache, PSODesc.Name);
}